

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,EnumType *type,string_view overrideName)

{
  size_t sVar1;
  bool bVar2;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  size_t sVar3;
  char *end;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> extraout_RDX;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> this_01;
  char *begin;
  FormatBuffer *pFVar5;
  format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_> fmt;
  format_string<const_int_&> fmt_00;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar6;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  string local_50;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar4;
  
  begin = overrideName._M_str;
  sVar3 = overrideName._M_len;
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    printScope(this,(type->super_IntegralType).super_Type.super_Symbol.parentScope);
    sVar1 = (type->super_IntegralType).super_Type.super_Symbol.name._M_len;
    if (sVar1 == 0) {
      pFVar5 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      if (sVar3 == 0) {
        begin = "<unnamed enum>";
        end = "";
      }
      else {
        end = begin + sVar3;
      }
    }
    else {
      pFVar5 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      begin = (type->super_IntegralType).super_Type.super_Symbol.name._M_str;
      end = begin + sVar1;
    }
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)pFVar5,begin,end);
    return;
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"enum","");
  if ((this->options).fullEnumType == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," ","");
    pFVar5 = (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    Type::toString_abi_cxx11_(&local_50,type->baseType);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)pFVar5,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  sVar6 = Scope::membersOfType<slang::ast::EnumValueSymbol>(&type->super_Scope);
  sVar4 = sVar6._M_end.current;
  __begin3 = sVar6._M_begin.current;
  bVar2 = true;
  while (this_01 = sVar6._M_begin.current, this_01.current != sVar4.current) {
    if (!bVar2) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,",","");
    }
    __v = &EnumValueSymbol::getValue((EnumValueSymbol *)this_01.current,(SourceRange)ZEXT816(0))->
           value;
    this_00 = std::
              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (__v);
    pFVar5 = (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    SVInt::toString_abi_cxx11_(&local_50,this_00,Decimal,true,0xffffff);
    fmt.str.size_ = 5;
    fmt.str.data_ = "{}={}";
    FormatBuffer::
    format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
              (pFVar5,fmt,&(this_01.current)->name,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>::increment(&__begin3);
    bVar2 = false;
    sVar6._M_end.current = extraout_RDX.current;
    sVar6._M_begin.current = __begin3.current;
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"}","");
  if ((this->options).skipScopedTypeNames == false) {
    if (sVar3 == 0) {
      printScope(this,(type->super_IntegralType).super_Type.super_Symbol.parentScope);
      sVar3 = (type->super_IntegralType).super_Type.super_Symbol.name._M_len;
      pFVar5 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      if (sVar3 == 0) {
        fmt_00.str.size_ = 4;
        fmt_00.str.data_ = "e${}";
        FormatBuffer::format<int_const&>(pFVar5,fmt_00,&type->systemId);
        return;
      }
      begin = (type->super_IntegralType).super_Type.super_Symbol.name._M_str;
    }
    else {
      pFVar5 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    }
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)pFVar5,begin,begin + sVar3);
  }
  return;
}

Assistant:

void TypePrinter::visit(const EnumType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (!type.name.empty())
            buffer->append(type.name);
        else if (overrideName.empty())
            buffer->append("<unnamed enum>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("enum");
        if (options.fullEnumType) {
            buffer->append(" ");
            buffer->append(type.baseType.toString());
        }
        buffer->append("{");

        bool first = true;
        for (const auto& member : type.values()) {
            if (!first)
                buffer->append(",");

            auto& value = member.getValue().integer();
            buffer->format("{}={}", member.name,
                           value.toString(LiteralBase::Decimal, /* includeBase */ true));
            first = false;
        }
        buffer->append("}");

        if (options.skipScopedTypeNames) {
            // Nothing to do here.
        }
        else if (!overrideName.empty()) {
            buffer->append(overrideName);
        }
        else {
            printScope(type.getParentScope());
            if (type.name.empty())
                buffer->format("e${}", type.systemId);
            else
                buffer->append(type.name);
        }
    }
}